

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::createReader
          (ReaderMgr *this,InputSource *src,bool param_2,RefFrom refFrom,Types type,Sources source,
          bool calcSrcOfs,XMLSize_t lowWaterMark)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLPlatformUtilsException *anon_var_0;
  OutOfMemoryException *anon_var_0_1;
  XMLCh *local_78;
  XMLCh *encoding;
  XMLReader *retVal;
  Janitor<xercesc_4_0::BinInputStream> streamJanitor;
  BinInputStream *newStream;
  bool calcSrcOfs_local;
  Sources source_local;
  Types type_local;
  RefFrom refFrom_local;
  bool param_2_local;
  InputSource *src_local;
  ReaderMgr *this_local;
  
  iVar2 = (*src->_vptr_InputSource[2])();
  streamJanitor.fData = (BinInputStream *)CONCAT44(extraout_var,iVar2);
  if (streamJanitor.fData == (BinInputStream *)0x0) {
    this_local = (ReaderMgr *)0x0;
  }
  else {
    Janitor<xercesc_4_0::BinInputStream>::Janitor
              ((Janitor<xercesc_4_0::BinInputStream> *)&retVal,streamJanitor.fData);
    iVar2 = (*src->_vptr_InputSource[3])();
    local_78 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    if (local_78 == (XMLCh *)0x0) {
      iVar2 = (*(streamJanitor.fData)->_vptr_BinInputStream[5])();
      local_78 = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
    }
    if (local_78 == (XMLCh *)0x0) {
      encoding = (XMLCh *)XMemory::operator_new(0x280c0,this->fMemoryManager);
      iVar2 = (*src->_vptr_InputSource[4])();
      iVar3 = (*src->_vptr_InputSource[5])();
      XMLReader::XMLReader
                ((XMLReader *)encoding,(XMLCh *)CONCAT44(extraout_var_04,iVar2),
                 (XMLCh *)CONCAT44(extraout_var_05,iVar3),streamJanitor.fData,refFrom,type,source,
                 false,calcSrcOfs,lowWaterMark,this->fXMLVersion,this->fMemoryManager);
    }
    else {
      encoding = (XMLCh *)XMemory::operator_new(0x280c0,this->fMemoryManager);
      iVar2 = (*src->_vptr_InputSource[4])();
      iVar3 = (*src->_vptr_InputSource[5])();
      XMLReader::XMLReader
                ((XMLReader *)encoding,(XMLCh *)CONCAT44(extraout_var_02,iVar2),
                 (XMLCh *)CONCAT44(extraout_var_03,iVar3),streamJanitor.fData,local_78,refFrom,type,
                 source,false,calcSrcOfs,lowWaterMark,this->fXMLVersion,this->fMemoryManager);
    }
    if (encoding == (XMLCh *)0x0) {
      __assert_fail("retVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                    ,500,
                    "XMLReader *xercesc_4_0::ReaderMgr::createReader(const InputSource &, const bool, const XMLReader::RefFrom, const XMLReader::Types, const XMLReader::Sources, const bool, XMLSize_t)"
                   );
    }
    Janitor<xercesc_4_0::BinInputStream>::release((Janitor<xercesc_4_0::BinInputStream> *)&retVal);
    uVar1 = this->fNextReaderNum;
    this->fNextReaderNum = uVar1 + 1;
    XMLReader::setReaderNum((XMLReader *)encoding,(ulong)uVar1);
    this_local = (ReaderMgr *)encoding;
    Janitor<xercesc_4_0::BinInputStream>::~Janitor((Janitor<xercesc_4_0::BinInputStream> *)&retVal);
  }
  return (XMLReader *)this_local;
}

Assistant:

XMLReader* ReaderMgr::createReader( const   InputSource&        src
                                    , const bool
                                    , const XMLReader::RefFrom  refFrom
                                    , const XMLReader::Types    type
                                    , const XMLReader::Sources  source
                                    , const bool                calcSrcOfs
                                    ,       XMLSize_t           lowWaterMark)
{
    //
    //  Ask the input source to create us an input stream. The particular
    //  type of input source will know what kind to create.
    //
    BinInputStream* newStream = src.makeStream();
    if (!newStream)
        return 0;

    Janitor<BinInputStream>   streamJanitor(newStream);

    //
    //  Create a new reader and return it. If the source has an encoding that
    //  it wants to force, then we call the constructor that does that.
    //  Otherwise, we just call the one that provides the provisional encoding
    //  to be possibly updated later by the encoding="" setting.
    //
    XMLReader* retVal = 0;

    // XMLReader ctor invokes refreshRawBuffer() which calls
    // newStream->readBytes().
    // This readBytes() may throw exception, which neither
    // refresRawBuffer(), nor XMLReader ctor catches.
    // We need to handle this exception to avoid leak on newStream.

    try {
		const XMLCh* encoding = src.getEncoding();
		if(encoding == 0)
			encoding = newStream->getEncoding();
        if (encoding)
        {
            retVal = new (fMemoryManager) XMLReader
                (
                src.getPublicId()
                , src.getSystemId()
                , newStream
                , encoding
                , refFrom
                , type
                , source
                , false
                , calcSrcOfs
                , lowWaterMark
                , fXMLVersion
                , fMemoryManager
                );
        }
        else
        {
            retVal = new (fMemoryManager) XMLReader
                (
                src.getPublicId()
                , src.getSystemId()
                , newStream
                , refFrom
                , type
                , source
                , false
                , calcSrcOfs
                , lowWaterMark
                , fXMLVersion
                , fMemoryManager
                );
        }
    }
    catch(const XMLPlatformUtilsException&)
    {
        streamJanitor.release();

        throw;
    }
    catch(const OutOfMemoryException&)
    {
        streamJanitor.release();

        throw;
    }

    assert(retVal);

    streamJanitor.release();

    // Set the next available reader number on this reader
    retVal->setReaderNum(fNextReaderNum++);
    return retVal;
}